

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# process.cpp
# Opt level: O2

VOID CorUnix::PROCAddThread(CPalThread *pCurrentThread,CPalThread *pTargetThread)

{
  InternalEnterCriticalSection(pCurrentThread,&g_csProcess);
  pTargetThread->m_pNext = pGThreadList;
  g_dwThreadCount = g_dwThreadCount + 1;
  pGThreadList = pTargetThread;
  if (PAL_InitializeChakraCoreCalled != false) {
    InternalLeaveCriticalSection(pCurrentThread,&g_csProcess);
    return;
  }
  abort();
}

Assistant:

VOID
CorUnix::PROCAddThread(
    CPalThread *pCurrentThread,
    CPalThread *pTargetThread
    )
{
    /* protect the access of the thread list with critical section for
       mutithreading access */
    InternalEnterCriticalSection(pCurrentThread, &g_csProcess);

    pTargetThread->SetNext(pGThreadList);
    pGThreadList = pTargetThread;
    g_dwThreadCount += 1;

    TRACE("Thread 0x%p (id %#x) added to the process thread list\n",
          pTargetThread, pTargetThread->GetThreadId());

    InternalLeaveCriticalSection(pCurrentThread, &g_csProcess);
}